

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void __thiscall embree::TutorialBenchmark::~TutorialBenchmark(TutorialBenchmark *this)

{
  CommandLineParser *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  (in_RDI->commandLineOptionList).
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_postParseCommandLine_00602e38;
  BenchParams::~BenchParams((BenchParams *)0x11dd4d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].commandLineOptionList.
              super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  CommandLineParser::~CommandLineParser(in_RDI);
  return;
}

Assistant:

static bool benchmark(int argc, char** argv) {
    for (int i = 0; i < argc; ++i)
      if (std::string(argv[i]) == "--benchmark")
        return true;
    return false;
  }